

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void compact_int32_suite::fail_array16_int32_missing_five(void)

{
  undefined4 local_44;
  value local_40 [2];
  undefined1 local_38 [8];
  decoder decoder;
  value_type input [6];
  
  decoder.current.view._M_str._2_4_ = 0x110008bc;
  decoder.current.view._M_str._6_2_ = 0x3322;
  trial::protocol::bintoken::detail::decoder::decoder<unsigned_char[6]>
            ((decoder *)local_38,(uchar (*) [6])((long)&decoder.current.view._M_str + 2));
  local_40[0] = trial::protocol::bintoken::detail::decoder::code((decoder *)local_38);
  local_44 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x8f7,"void compact_int32_suite::fail_array16_int32_missing_five()",local_40,&local_44
            );
  return;
}

Assistant:

void fail_array16_int32_missing_five()
{
    const value_type input[] = { token::code::array16_int32, 0x08, 0x00, 0x11, 0x22, 0x33 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}